

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Code parse(TokenList *list)

{
  undefined8 *puVar1;
  int iVar2;
  Compiler *c;
  Statement *__ptr;
  uint uVar3;
  size_t __size;
  Code CVar4;
  Statement local_70;
  
  uVar3 = 0;
  head = list;
  c = initCompiler((Compiler *)0x0,0,BLOCK_NONE);
  __size = 0x40;
  __ptr = (Statement *)0x0;
  while( true ) {
    iVar2 = match(TOKEN_EOF);
    if (iVar2 != 0) break;
    __ptr = (Statement *)realloc(__ptr,__size);
    part(&local_70,c);
    puVar1 = (undefined8 *)((long)__ptr + (__size - 0x10));
    *puVar1 = local_70.field_1.ifStatement.elseBranch.statements;
    puVar1[1] = local_70.field_1.routine.code.statements;
    puVar1 = (undefined8 *)((long)__ptr + (__size - 0x20));
    *puVar1 = local_70.field_1.ifStatement.thenBranch.statements;
    puVar1[1] = local_70.field_1._32_8_;
    puVar1 = (undefined8 *)((long)__ptr + (__size - 0x30));
    *puVar1 = local_70.field_1.blockStatement.statements;
    puVar1[1] = local_70.field_1.breakStatement.pos.file;
    puVar1 = (undefined8 *)((long)&__ptr[-1].type + __size);
    *puVar1 = local_70._0_8_;
    puVar1[1] = local_70.field_1._0_8_;
    uVar3 = uVar3 + 1;
    __size = __size + 0x40;
  }
  free(c);
  CVar4._4_4_ = 0;
  CVar4.count = uVar3;
  CVar4.parts = __ptr;
  return CVar4;
}

Assistant:

Code parse(TokenList *list){
    Code c = {0, NULL};
    head = list;
    Compiler *comp = initCompiler(NULL, 0, BLOCK_NONE);
    while(!match(TOKEN_EOF)){
        c.count++;
        c.parts = (Statement *)reallocate(c.parts, sizeof(Statement) * c.count);
        c.parts[c.count - 1] = part(comp);
    }
    memfree(comp);
    return c;
}